

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int quantize_segment_info(mixed_segment_info *info,mixed_segment *segment)

{
  info->name = "quantize";
  info->description = "Quantize the signal to a specified number of intervals.";
  info->flags = MIXED_IN;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  set_info_field(info->fields + 1,0x29,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "How much of the output to mix with the input.");
  set_info_field(info->fields + 2,1,MIXED_BOOL,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Bypass the segment\'s processing.");
  clear_info_field(info->fields + 3);
  return 1;
}

Assistant:

int quantize_segment_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);
  info->name = "quantize";
  info->description = "Quantize the signal to a specified number of intervals.";
  info->flags = MIXED_INPLACE;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");

  set_info_field(field++, MIXED_MIX,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "How much of the output to mix with the input.");

  set_info_field(field++, MIXED_BYPASS,
                 MIXED_BOOL, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Bypass the segment's processing.");

  clear_info_field(field++);
  return 1;
}